

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

string * __thiscall
chaiscript::detail::Dispatch_Engine::get_type_name_abi_cxx11_
          (string *__return_storage_ptr__,Dispatch_Engine *this,Type_Info *ti)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  char *__s;
  allocator<char> local_29;
  
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  p_Var2 = (this->m_state).m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->m_state).m_types._M_t._M_impl.super__Rb_tree_header) {
      if ((ti->m_flags & 0x20) == 0) {
        __s = *(char **)(ti->m_bare_type_info + 8) + (**(char **)(ti->m_bare_type_info + 8) == '*');
      }
      else {
        __s = "";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_29);
LAB_003185b9:
      pthread_rwlock_unlock((pthread_rwlock_t *)this);
      return __return_storage_ptr__;
    }
    bVar1 = Type_Info::bare_equal((Type_Info *)(p_Var2 + 2),ti);
    if (bVar1) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*(long *)(p_Var2 + 1),
                 (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
      goto LAB_003185b9;
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

std::string get_type_name(const Type_Info &ti) const {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        for (const auto &elem : m_state.m_types) {
          if (elem.second.bare_equal(ti)) {
            return elem.first;
          }
        }

        return ti.bare_name();
      }